

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

path_node_type * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
::create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
          (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
           *this,basic_path_node<char> **args,unsigned_long *args_1)

{
  basic_path_node<char> *pbVar1;
  size_t sVar2;
  _Head_base<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_false> _Var3;
  size_t sVar4;
  pointer *__ptr;
  __uniq_ptr_impl<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
  local_28;
  
  _Var3._M_head_impl = (basic_path_node<char> *)operator_new(0x30);
  pbVar1 = *args;
  sVar2 = *args_1;
  (_Var3._M_head_impl)->parent_ = pbVar1;
  if (pbVar1 == (basic_path_node<char> *)0x0) {
    sVar4 = 1;
  }
  else {
    sVar4 = pbVar1->size_ + 1;
  }
  (_Var3._M_head_impl)->size_ = sVar4;
  (_Var3._M_head_impl)->node_kind_ = index;
  ((_Var3._M_head_impl)->name_)._M_len = 0;
  ((_Var3._M_head_impl)->name_)._M_str = (char *)0x0;
  (_Var3._M_head_impl)->index_ = sVar2;
  local_28._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
  .super__Head_base<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_false>._M_head_impl =
       (tuple<jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
        )(tuple<jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
          )_Var3._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<char>,std::default_delete<jsoncons::jsonpath::basic_path_node<char>>>>>
              *)(this + 0x20),
             (unique_ptr<jsoncons::jsonpath::basic_path_node<char>,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
        .super__Head_base<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_false>._M_head_impl !=
      (basic_path_node<char> *)0x0) {
    operator_delete((void *)local_28._M_t.
                            super__Tuple_impl<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_std::default_delete<jsoncons::jsonpath::basic_path_node<char>_>_>
                            .
                            super__Head_base<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_false>
                            ._M_head_impl,0x30);
  }
  return (_Head_base<0UL,_jsoncons::jsonpath::basic_path_node<char>_*,_false>)_Var3._M_head_impl;
}

Assistant:

const path_node_type* create_path_node(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<path_node_type>(std::forward<Args>(args)...);
            path_node_type* ptr = temp.get();
            temp_node_values_.push_back(std::move(temp));
            return ptr;
        }